

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.h
# Opt level: O3

void rengine::animation_rotateZ(AnimationManager *manager,TransformNode *node,float duration)

{
  Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
  *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  float *pfVar1;
  shared_ptr<rengine::AbstractAnimation> local_40;
  float local_2c;
  
  local_2c = duration;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00136c78;
  this = (Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
          *)(this_00 + 1);
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  *(byte *)&this_00[3]._vptr__Sp_counted_base = *(byte *)&this_00[3]._vptr__Sp_counted_base & 0xf8;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Animation_00136cc8;
  *(TransformNode **)&this_00[3]._M_use_count = node;
  this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[4]._M_use_count = 0;
  this_00[4]._M_weak_count = 0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(double *)&this_00[2]._M_use_count = (double)local_2c;
  *(undefined4 *)&this_00[2]._vptr__Sp_counted_base = 0xffffffff;
  pfVar1 = Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
           ::newKeyFrame(this,0.0);
  *pfVar1 = 0.0;
  pfVar1 = Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
           ::newKeyFrame(this,1.0);
  *pfVar1 = 6.2831855;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this_00;
  AnimationManager::start(manager,&local_40,0.0);
  if (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

inline void animation_rotateZ(AnimationManager *manager, TransformNode *node, float duration)
{
    auto anim = std::make_shared<Animation_aroundZ_linear>(node);
    anim->setDuration(duration);
    anim->setIterations(-1);
    anim->newKeyFrame(0) = 0;
    anim->newKeyFrame(1) = M_PI * 2;
    manager->start(anim);
}